

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O3

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::remove_vertex
          (DynamicPartialIndex *this,vertex_t v,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *out,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *in)

{
  Index *pIVar1;
  bool bVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  degree_t dVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar9;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar10;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
  _Var11;
  const_iterator cVar12;
  pointer ppVar13;
  pointer ppVar14;
  uint uVar15;
  ulong uVar16;
  DegreeQueue *this_00;
  _Hash_node_base *p_Var17;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var18;
  __hashtable *__h_5;
  uint cur;
  __hashtable *__h_1;
  __hashtable *__h_4;
  __hashtable *__h;
  allocator_type local_79;
  vertex_t local_78;
  uint local_74;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  pIVar1 = &this->succ_temp_;
  local_78 = v;
  local_48 = in;
  local_40 = out;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&pIVar1->_M_h);
  local_70 = &(this->succ_)._M_h;
  local_38 = &pIVar1->_M_h;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::swap(local_70,&pIVar1->_M_h);
  p_Var18 = &(this->pred_temp_)._M_h;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(p_Var18);
  pIVar1 = &this->pred_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::swap(&pIVar1->_M_h,p_Var18);
  set_degree(this);
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  dVar6 = Graph::num_vertices(this->graph_);
  if (dVar6 != 0) {
    do {
      puVar3 = (this->degree_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->degree_->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <=
          ((ulong)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start & 0xffffffff)) goto LAB_0010b832;
      std::
      priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
      ::emplace<unsigned_int&,unsigned_int&>
                ((priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
                  *)this->quedeg_,
                 puVar3 + ((ulong)local_68.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffff),
                 (uint *)&local_68);
      uVar15 = (int)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_68.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,uVar15);
      dVar6 = Graph::num_vertices(this->graph_);
    } while (uVar15 < dVar6);
  }
  this_00 = this->quedeg_;
  ppVar13 = (this_00->c).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar14 = (this_00->c).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar13 != ppVar14) {
    if ((this->succ_)._M_h._M_element_count != (ulong)this->budget_) {
      local_50 = p_Var18;
      do {
        uVar15 = ppVar13->first;
        local_74 = ppVar13->second;
        std::
        priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
        ::pop(this_00);
        if (uVar15 != 0) {
          uVar16 = (ulong)local_74;
          puVar3 = (this->degree_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->degree_->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar16)
          goto LAB_0010b832;
          if (puVar3[uVar16] != 0) {
            if (uVar15 == puVar3[uVar16]) {
              bVar2 = this->isD2_;
              iVar7 = std::
                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(local_38,&local_74);
              if (bVar2 == false) {
                if (iVar7.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                    ._M_cur == (__node_type *)0x0) {
                  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start =
                       (pointer)CONCAT44(local_68.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,local_74);
                  cVar12 = std::
                           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(&(this->parent_->D2_).succ_._M_h,(key_type *)&local_68);
                  if (cVar12.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur == (__node_type *)0x0) {
                    dVar6 = Graph::num_vertices(this->graph_);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              (&local_68,(ulong)dVar6,"?21DynamicScalableKReach",&local_79);
                    pmVar8 = std::__detail::
                             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)local_70,&local_74);
                    puVar4 = (pmVar8->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    puVar5 = (pmVar8->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    (pmVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start =
                         local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                    (pmVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    (pmVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    if ((puVar4 != (pointer)0x0) &&
                       (operator_delete(puVar4,(long)puVar5 - (long)puVar4),
                       local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(local_68.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_68.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_68.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar15 = local_74;
                    pvVar9 = Graph::graph(this->graph_);
                    iVar7 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(local_70,&local_74);
                    if (iVar7.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      construct_bfs(this,uVar15,pvVar9,
                                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    ((long)iVar7.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                           ._M_cur + 0x10));
                      dVar6 = Graph::num_vertices(this->graph_);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                                (&local_68,(ulong)dVar6,"?21DynamicScalableKReach",&local_79);
                      pmVar8 = std::__detail::
                               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                             *)pIVar1,&local_74);
                      goto LAB_0010b719;
                    }
                  }
                  else {
                    iVar7 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(&(this->parent_->D2_).succ_._M_h,&local_74);
                    if (iVar7.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      pmVar8 = std::__detail::
                               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                             *)local_70,&local_74);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                                (pmVar8,(long)iVar7.
                                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                              ._M_cur + 0x10);
                      for (p_Var17 = (this->succ_temp_)._M_h._M_before_begin._M_nxt;
                          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
                        iVar7 = std::
                                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                ::find(local_70,&local_74);
                        if (iVar7.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                            ._M_cur == (__node_type *)0x0) goto LAB_0010b813;
                        uVar15 = *(uint *)&p_Var17[1]._M_nxt;
                        if ((ulong)(*(long *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x18) -
                                   *(long *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10)) <= (ulong)uVar15)
                        goto LAB_0010b832;
                        if (*(char *)(*(long *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10) + (ulong)uVar15) != '?') {
                          pvVar9 = Graph::graph(this->graph_);
                          iVar7 = std::
                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                  ::find(local_70,&local_74);
                          if (iVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                              ._M_cur == (__node_type *)0x0) goto LAB_0010b813;
                          resume_bfs(this,uVar15,pvVar9,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     ((long)iVar7.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                            ._M_cur + 0x10));
                        }
                      }
                      pvVar9 = Graph::graph(this->graph_);
                      pvVar10 = Graph::reverse_graph(this->graph_);
                      iVar7 = std::
                              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              ::find(local_70,&local_74);
                      if (iVar7.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                          ._M_cur != (__node_type *)0x0) {
                        update_remove(this,local_78,local_40,pvVar9,pvVar10,
                                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      ((long)iVar7.
                                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                             ._M_cur + 0x10));
                        iVar7 = std::
                                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                ::find(&(this->parent_->D2_).pred_._M_h,&local_74);
                        if (iVar7.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                            ._M_cur != (__node_type *)0x0) {
                          pmVar8 = std::__detail::
                                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                 *)pIVar1,&local_74);
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                                    (pmVar8,(long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10);
                          for (p_Var17 = (this->succ_temp_)._M_h._M_before_begin._M_nxt;
                              p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
                            iVar7 = std::
                                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                    ::find(&pIVar1->_M_h,&local_74);
                            if (iVar7.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                ._M_cur == (__node_type *)0x0) goto LAB_0010b813;
                            uVar15 = *(uint *)&p_Var17[1]._M_nxt;
                            if ((ulong)(*(long *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x18) -
                                       *(long *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10)) <= (ulong)uVar15)
                            goto LAB_0010b832;
                            if (*(char *)(*(long *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10) + (ulong)uVar15) != '?') {
                              pvVar9 = Graph::reverse_graph(this->graph_);
                              iVar7 = std::
                                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      ::find(&pIVar1->_M_h,&local_74);
                              if (iVar7.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                  ._M_cur == (__node_type *)0x0) goto LAB_0010b813;
                              resume_bfs(this,uVar15,pvVar9,
                                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         ((long)iVar7.
                                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                ._M_cur + 0x10));
                            }
                          }
                          goto LAB_0010b4fc;
                        }
                      }
                    }
                  }
                }
                else {
                  iVar7 = std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::find(local_38,&local_74);
                  p_Var18 = local_70;
                  if (iVar7.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur != (__node_type *)0x0) {
                    pmVar8 = std::__detail::
                             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)local_70,&local_74);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                              (pmVar8,(long)iVar7.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                            ._M_cur + 0x10);
                    pvVar9 = Graph::graph(this->graph_);
                    pvVar10 = Graph::reverse_graph(this->graph_);
                    iVar7 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(p_Var18,&local_74);
                    if (iVar7.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      update_remove(this,local_78,local_40,pvVar9,pvVar10,
                                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    ((long)iVar7.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                           ._M_cur + 0x10));
                      p_Var18 = local_50;
                      _Var11._M_cur =
                           (__node_type *)
                           std::
                           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(local_50,&local_74);
joined_r0x0010b0ed:
                      if (_Var11._M_cur != (__node_type *)0x0) {
                        pmVar8 = std::__detail::
                                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)pIVar1,&local_74);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                                  (pmVar8,(undefined1 *)
                                          ((long)&((_Var11._M_cur)->
                                                  super__Hash_node_value<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_storage._M_storage + 8));
                        pvVar9 = Graph::reverse_graph(this->graph_);
                        pvVar10 = Graph::graph(this->graph_);
                        iVar7 = std::
                                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                ::find(&pIVar1->_M_h,&local_74);
                        if (iVar7.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                            ._M_cur != (__node_type *)0x0) {
                          update_remove(this,local_78,local_48,pvVar9,pvVar10,
                                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        ((long)iVar7.
                                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                               ._M_cur + 0x10));
                          goto LAB_0010b7a0;
                        }
                      }
                    }
                  }
                }
              }
              else if (iVar7.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                       ._M_cur == (__node_type *)0x0) {
                iVar7 = std::
                        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(&(this->parent_->D1_).succ_temp_._M_h,&local_74);
                if (iVar7.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                    ._M_cur == (__node_type *)0x0) {
                  dVar6 = Graph::num_vertices(this->graph_);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            (&local_68,(ulong)dVar6,"?21DynamicScalableKReach",&local_79);
                  pmVar8 = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_70,&local_74);
                  puVar4 = (pmVar8->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  puVar5 = (pmVar8->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                  (pmVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start =
                       local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  (pmVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  (pmVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start = (pointer)0x0;
                  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if ((puVar4 != (pointer)0x0) &&
                     (operator_delete(puVar4,(long)puVar5 - (long)puVar4),
                     local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                    operator_delete(local_68.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_68.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_68.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  uVar15 = local_74;
                  pvVar9 = Graph::graph(this->graph_);
                  iVar7 = std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::find(local_70,&local_74);
                  if (iVar7.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur != (__node_type *)0x0) {
                    construct_bfs(this,uVar15,pvVar9,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  ((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                         ._M_cur + 0x10));
                    dVar6 = Graph::num_vertices(this->graph_);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              (&local_68,(ulong)dVar6,"?21DynamicScalableKReach",&local_79);
                    pmVar8 = std::__detail::
                             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)pIVar1,&local_74);
LAB_0010b719:
                    puVar4 = (pmVar8->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    puVar5 = (pmVar8->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    (pmVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start =
                         local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                    (pmVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    (pmVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    if ((puVar4 != (pointer)0x0) &&
                       (operator_delete(puVar4,(long)puVar5 - (long)puVar4),
                       local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(local_68.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_68.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_68.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar15 = local_74;
                    pvVar9 = Graph::reverse_graph(this->graph_);
                    iVar7 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(&pIVar1->_M_h,&local_74);
                    if (iVar7.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      construct_bfs(this,uVar15,pvVar9,
                                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    ((long)iVar7.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                           ._M_cur + 0x10));
LAB_0010b7a0:
                      std::
                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_erase(local_38,&local_74);
                      std::
                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_erase(p_Var18,&local_74);
                      update_cover(this,local_74);
                      goto LAB_0010b7ca;
                    }
                  }
                }
                else {
                  iVar7 = std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::find(&(this->parent_->D1_).succ_temp_._M_h,&local_74);
                  p_Var18 = local_70;
                  if (iVar7.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur != (__node_type *)0x0) {
                    pmVar8 = std::__detail::
                             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)local_70,&local_74);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                              (pmVar8,(long)iVar7.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                            ._M_cur + 0x10);
                    pvVar9 = Graph::graph(this->graph_);
                    pvVar10 = Graph::reverse_graph(this->graph_);
                    iVar7 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(p_Var18,&local_74);
                    if (iVar7.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      update_remove(this,local_78,local_40,pvVar9,pvVar10,
                                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    ((long)iVar7.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                           ._M_cur + 0x10));
                      _Var11._M_cur =
                           (__node_type *)
                           std::
                           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(&(this->parent_->D1_).pred_temp_._M_h,&local_74);
                      p_Var18 = local_50;
                      goto joined_r0x0010b0ed;
                    }
                  }
                }
              }
              else {
                iVar7 = std::
                        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(local_38,&local_74);
                if (iVar7.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                    ._M_cur != (__node_type *)0x0) {
                  pmVar8 = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_70,&local_74);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                            (pmVar8,(long)iVar7.
                                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                          ._M_cur + 0x10);
                  for (p_Var17 = (this->parent_->D1_).succ_temp_._M_h._M_before_begin._M_nxt;
                      p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
                    iVar7 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(local_70,&local_74);
                    if (iVar7.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur == (__node_type *)0x0) goto LAB_0010b813;
                    uVar15 = *(uint *)&p_Var17[1]._M_nxt;
                    if ((ulong)(*(long *)((long)iVar7.
                                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                ._M_cur + 0x18) -
                               *(long *)((long)iVar7.
                                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                               ._M_cur + 0x10)) <= (ulong)uVar15) goto LAB_0010b832;
                    if (*(char *)(*(long *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10) + (ulong)uVar15) != '?') {
                      pvVar9 = Graph::graph(this->graph_);
                      iVar7 = std::
                              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              ::find(local_70,&local_74);
                      if (iVar7.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                          ._M_cur == (__node_type *)0x0) goto LAB_0010b813;
                      resume_bfs(this,uVar15,pvVar9,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 ((long)iVar7.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                        ._M_cur + 0x10));
                    }
                  }
                  pvVar9 = Graph::graph(this->graph_);
                  pvVar10 = Graph::reverse_graph(this->graph_);
                  iVar7 = std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::find(local_70,&local_74);
                  if (iVar7.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur != (__node_type *)0x0) {
                    update_remove(this,local_78,local_40,pvVar9,pvVar10,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  ((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                         ._M_cur + 0x10));
                    iVar7 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(local_50,&local_74);
                    if (iVar7.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      pmVar8 = std::__detail::
                               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                             *)pIVar1,&local_74);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                                (pmVar8,(long)iVar7.
                                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                              ._M_cur + 0x10);
                      for (p_Var17 = (this->parent_->D1_).succ_temp_._M_h._M_before_begin._M_nxt;
                          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
                        iVar7 = std::
                                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                ::find(&pIVar1->_M_h,&local_74);
                        if (iVar7.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                            ._M_cur == (__node_type *)0x0) goto LAB_0010b813;
                        uVar15 = *(uint *)&p_Var17[1]._M_nxt;
                        if ((ulong)(*(long *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x18) -
                                   *(long *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10)) <= (ulong)uVar15)
                        goto LAB_0010b832;
                        if (*(char *)(*(long *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10) + (ulong)uVar15) != '?') {
                          pvVar9 = Graph::reverse_graph(this->graph_);
                          iVar7 = std::
                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                  ::find(&pIVar1->_M_h,&local_74);
                          if (iVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                              ._M_cur == (__node_type *)0x0) goto LAB_0010b813;
                          resume_bfs(this,uVar15,pvVar9,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     ((long)iVar7.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                            ._M_cur + 0x10));
                        }
                      }
LAB_0010b4fc:
                      pvVar9 = Graph::reverse_graph(this->graph_);
                      pvVar10 = Graph::graph(this->graph_);
                      iVar7 = std::
                              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              ::find(&pIVar1->_M_h,&local_74);
                      if (iVar7.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                          ._M_cur != (__node_type *)0x0) {
                        update_remove(this,local_78,local_48,pvVar9,pvVar10,
                                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      ((long)iVar7.
                                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                             ._M_cur + 0x10));
                        p_Var18 = local_50;
                        goto LAB_0010b7a0;
                      }
                    }
                  }
                }
              }
LAB_0010b813:
              std::__throw_out_of_range("_Map_base::at");
LAB_0010b832:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            std::
            priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
            ::emplace<unsigned_int&,unsigned_int&>
                      ((priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
                        *)this->quedeg_,puVar3 + uVar16,&local_74);
          }
        }
LAB_0010b7ca:
        this_00 = this->quedeg_;
        ppVar13 = (this_00->c).
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar14 = (this_00->c).
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar13 == ppVar14) {
          return;
        }
      } while ((this->succ_)._M_h._M_element_count != (ulong)this->budget_);
    }
    if (ppVar13 != ppVar14) {
      do {
        std::
        priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
        ::pop(this_00);
        this_00 = this->quedeg_;
      } while ((this_00->c).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this_00->c).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::remove_vertex(vertex_t v, const std::vector<vertex_t> &out,
                                                               const std::vector<vertex_t> &in) {
    succ_temp_.clear();
    swap(succ_, succ_temp_);
    pred_temp_.clear();
    swap(pred_, pred_temp_);
    set_degree();
    for (degree_t i = 0; i < graph_.num_vertices(); ++i) {
        quedeg_.emplace(degree_.at(i), i);
    }
    while (!quedeg_.empty() && succ_.size() != budget_) {
        auto deg = quedeg_.top().first;
        auto cur = quedeg_.top().second;
        quedeg_.pop();
        if (deg <= 0 || degree_.at(cur) <= 0) {
            continue;
        }
        if (deg != degree_.at(cur)) {
            quedeg_.emplace(degree_.at(cur), cur);
            continue;
        }
        if (!isD2_) { // is D1
            if (succ_temp_.find(cur) != succ_temp_.end()) { // was indexed
                succ_[cur] = move(succ_temp_.at(cur));
                update_remove(v, out, graph_.graph(), graph_.reverse_graph(), succ_.at(cur));
                pred_[cur] = move(pred_temp_.at(cur));
                update_remove(v, in, graph_.reverse_graph(), graph_.graph(), pred_.at(cur));
            }
            else if (parent_.D2_.indexed(cur)) { // indexed in D2
                succ_[cur] = move(parent_.D2_.succ_.at(cur));
                for (const auto &i : succ_temp_) {
                    if (succ_.at(cur).at(i.first) != INF8) {
                        resume_bfs(i.first, graph_.graph(), succ_.at(cur));
                    }
                }
                update_remove(v, out, graph_.graph(), graph_.reverse_graph(), succ_.at(cur));
                pred_[cur] = move(parent_.D2_.pred_.at(cur));
                for (const auto &i : succ_temp_) {
                    if (pred_.at(cur).at(i.first) != INF8) {
                        resume_bfs(i.first, graph_.reverse_graph(), pred_.at(cur));
                    }
                }
                update_remove(v, in, graph_.reverse_graph(), graph_.graph(), pred_.at(cur));
            }
            else { // not indexed before
                succ_[cur] = vector<distance_t>(graph_.num_vertices(), INF8);
                construct_bfs(cur, graph_.graph(), succ_.at(cur));
                pred_[cur] = vector<distance_t>(graph_.num_vertices(), INF8);
                construct_bfs(cur, graph_.reverse_graph(), pred_.at(cur));
            }
        }
        else { // is D2
            if (succ_temp_.find(cur) != succ_temp_.end()) { // was indexed
                succ_[cur] = move(succ_temp_.at(cur));
                for (const auto &i : parent_.D1_.succ_temp_) {
                    if (succ_.at(cur).at(i.first) != INF8) {
                        resume_bfs(i.first, graph_.graph(), succ_.at(cur));
                    }
                }
                update_remove(v, out, graph_.graph(), graph_.reverse_graph(), succ_.at(cur));
                pred_[cur] = move(pred_temp_.at(cur));
                for (const auto &i : parent_.D1_.succ_temp_) {
                    if (pred_.at(cur).at(i.first) != INF8) {
                        resume_bfs(i.first, graph_.reverse_graph(), pred_.at(cur));
                    }
                }
                update_remove(v, in, graph_.reverse_graph(), graph_.graph(), pred_.at(cur));
            }
            else if (parent_.D1_.succ_temp_.find(cur) != parent_.D1_.succ_temp_.end()) { // was indexed in D1
                succ_[cur] = move(parent_.D1_.succ_temp_.at(cur));
                update_remove(v, out, graph_.graph(), graph_.reverse_graph(), succ_.at(cur));
                pred_[cur] = move(parent_.D1_.pred_temp_.at(cur));
                update_remove(v, in, graph_.reverse_graph(), graph_.graph(), pred_.at(cur));
            }
            else { // not indexed before
                succ_[cur] = vector<distance_t>(graph_.num_vertices(), INF8);
                construct_bfs(cur, graph_.graph(), succ_.at(cur));
                pred_[cur] = vector<distance_t>(graph_.num_vertices(), INF8);
                construct_bfs(cur, graph_.reverse_graph(), pred_.at(cur));
            }
        }
        succ_temp_.erase(cur);
        pred_temp_.erase(cur);
        update_cover(cur);
    }
    while (!quedeg_.empty()) {
        quedeg_.pop();
    }
}